

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::PushParserState(AsciiParser *this)

{
  _Map_pointer ppPVar1;
  _Elt_pointer pPVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  ostringstream ss_e;
  string local_1b8;
  ParseState local_198 [14];
  ios_base local_128 [264];
  
  ppPVar1 = (this->parse_stack).c.
            super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pPVar2 = (this->parse_stack).c.
           super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uVar5 = ((long)(this->parse_stack).c.
                 super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->parse_stack).c.
                 super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)pPVar2 -
           (long)(this->parse_stack).c.
                 super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)ppPVar1 -
                    (long)(this->parse_stack).c.
                          super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppPVar1 == (_Map_pointer)0x0)) * 0x40;
  uVar3 = this->_sr->length_;
  if (uVar5 < uVar3) {
    local_198[0].loc = this->_sr->idx_;
    if (pPVar2 == (this->parse_stack).c.
                  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<tinyusdz::ascii::AsciiParser::ParseState,std::allocator<tinyusdz::ascii::AsciiParser::ParseState>>
      ::_M_push_back_aux<tinyusdz::ascii::AsciiParser::ParseState_const&>
                ((deque<tinyusdz::ascii::AsciiParser::ParseState,std::allocator<tinyusdz::ascii::AsciiParser::ParseState>>
                  *)&this->parse_stack,local_198);
    }
    else {
      pPVar2->loc = local_198[0].loc;
      (this->parse_stack).c.
      super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar2 + 1;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[ASCII]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"PushParserState",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_198,0x841);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Parser state stack become too deep.",0x23);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    ::std::ios_base::~ios_base(local_128);
  }
  return uVar5 < uVar3;
}

Assistant:

bool AsciiParser::PushParserState() {
  // Stack size must be less than the number of input bytes.
  if (parse_stack.size() >= _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Parser state stack become too deep.");
  }

  uint64_t loc = _sr->tell();

  ParseState state;
  state.loc = int64_t(loc);
  parse_stack.push(state);

  return true;
}